

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall BoardView::DrawPins(BoardView *this,ImDrawList *draw)

{
  float *pfVar1;
  unsigned_short *__src;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  Net *pNVar3;
  element_type *peVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  ImVec2 IVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  ImGuiIO *pIVar14;
  void *__dest;
  undefined4 extraout_var;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  _Var15;
  ImVec2 *pIVar16;
  ImVec2 IVar17;
  long lVar18;
  bool bVar19;
  ImFont *this_01;
  uint uVar20;
  uint uVar21;
  long *plVar22;
  byte bVar23;
  ImFont *font;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  ImVec2 pos_pin_name;
  string text;
  ImVec2 pos_net_name;
  ImGuiIO io;
  float local_3a30;
  uint32_t local_3a2c;
  uint local_3a10;
  uint local_3a0c;
  undefined1 local_3a08 [16];
  float local_39f8;
  float fStack_39f4;
  undefined1 local_39e8 [32];
  ImVec2 local_39c8 [2];
  long local_39b8 [2];
  ImVec2 local_39a8;
  ImVec2 local_39a0;
  long local_3998;
  ImVec2 IStack_3990;
  ImVec2 local_3984;
  int local_397c;
  undefined1 local_3978 [16];
  ImDrawListSplitter *local_3968;
  ImVec2 local_3960;
  ImVec2 local_3958;
  shared_ptr<Component> local_3950;
  long *local_3940;
  float local_3938;
  float fStack_3934;
  float fStack_3930;
  float fStack_392c;
  undefined1 local_3928 [11168];
  long local_d88;
  void *pvStack_d80;
  undefined1 auStack_d78 [3400];
  
  pIVar14 = ImGui::GetIO();
  memcpy(local_3928,pIVar14,0x2b9e);
  local_d88 = 0;
  pvStack_d80 = (void *)0x0;
  uVar21 = (pIVar14->InputQueueCharacters).Size;
  if (0 < (long)(int)uVar21) {
    uVar20 = 8;
    if (8 < (int)uVar21) {
      uVar20 = uVar21;
    }
    __dest = ImGui::MemAlloc((ulong)(uVar20 * 2));
    if (pvStack_d80 != (void *)0x0) {
      memcpy(__dest,pvStack_d80,(long)(int)local_d88 * 2);
      ImGui::MemFree(pvStack_d80);
    }
    local_d88 = (ulong)uVar20 << 0x20;
    pvStack_d80 = __dest;
  }
  local_d88 = CONCAT44(local_d88._4_4_,uVar21);
  __src = (pIVar14->InputQueueCharacters).Data;
  if (__src != (unsigned_short *)0x0) {
    memcpy(pvStack_d80,__src,(long)(int)uVar21 * 2);
  }
  memcpy(auStack_d78,pIVar14->KeyMap,0xd44);
  if ((this->config).showPins == true) {
    local_3a0c = 0xffffffff;
    local_3a10 = 0;
    if (((this->config).pinSelectMasks == true) &&
       (((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0 ||
        ((this->m_pinHighlighted).
         super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         (this->m_pinHighlighted).
         super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
         super__Vector_impl_data._M_start)))) {
      local_3a0c = (this->m_colors).selectedMaskPins;
      local_3a10 = (this->m_colors).orMaskPins;
    }
    if ((this->config).slowCPU == false) {
      fVar25 = 0.0;
    }
    else {
      fVar25 = 2.0;
    }
    local_3a30 = (this->config).pinSizeThresholdLow;
    local_3968 = &draw->_Splitter;
    ImDrawListSplitter::SetCurrentChannel(local_3968,draw,3);
    if ((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      DrawNetWeb(this,draw);
    }
    iVar13 = (*this->m_board->_vptr_Board[4])();
    plVar22 = *(long **)CONCAT44(extraout_var,iVar13);
    local_3940 = (long *)((long *)CONCAT44(extraout_var,iVar13))[1];
    if (plVar22 != local_3940) {
      if (local_3a30 <= fVar25) {
        local_3a30 = fVar25;
      }
      do {
        lVar18 = *plVar22;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar22[1];
        fVar25 = *(float *)(lVar18 + 0x58) * this->m_scale;
        local_3a2c = (this->m_colors).pinDefaultTextColor;
        uVar21 = (this->m_colors).pinDefaultColor;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        if (lVar18 == 0) {
          bVar19 = true;
        }
        else {
          bVar19 = *(int *)(lVar18 + 8) == 2 || *(int *)(lVar18 + 8) == this->m_current_side;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (bVar19) {
          IVar17 = CoordToScreen(this,*(float *)(*plVar22 + 0x50),*(float *)(*plVar22 + 0x54),1.0);
          fVar27 = IVar17.y;
          if (((((-fVar25 <= IVar17.x) && (-fVar25 <= fVar27)) &&
               (fVar26 = IVar17.x - fVar25,
               fVar26 < (this->m_board_surface).x || fVar26 == (this->m_board_surface).x)) &&
              (pfVar1 = &(this->m_board_surface).y,
              fVar27 - fVar25 < *pfVar1 || fVar27 - fVar25 == *pfVar1)) &&
             (((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (element_type *)0x0 || (local_3a30 <= fVar25)))) {
            local_3978._8_4_ = extraout_XMM0_Dc;
            local_3978._0_4_ = IVar17.x;
            local_3978._4_4_ = IVar17.y;
            local_3978._12_4_ = extraout_XMM0_Dd;
            local_3938 = fVar27;
            fStack_3934 = fVar27;
            fStack_3930 = fVar27;
            fStack_392c = fVar27;
            _Var15 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Pin>*,std::vector<std::shared_ptr<Pin>,std::allocator<std::shared_ptr<Pin>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<Pin>const>>
                               ((this->m_pinHighlighted).
                                super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (this->m_pinHighlighted).
                                super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,plVar22);
            if (_Var15._M_current ==
                (this->m_pinHighlighted).
                super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              uVar21 = uVar21 & local_3a0c | local_3a10;
              local_39e8._0_4_ = 0xffff8888;
              auVar10._12_4_ = 0;
              auVar10._0_12_ = local_3a08._4_12_;
              local_3a08 = auVar10 << 0x20;
            }
            else {
              dVar8 = (this->config).fontSize * 0.5;
              if ((double)fVar25 < dVar8) {
                fVar25 = (float)dVar8;
              }
              local_3a2c = (this->m_colors).pinSelectedTextColor;
              local_39e8._0_4_ = (this->m_colors).pinSelectedFillColor;
              uVar21 = (this->m_colors).pinSelectedColor;
              local_3a30 = 0.0;
              local_3a08._0_4_ = 1;
            }
            local_3950.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(element_type **)(*plVar22 + 0x68);
            local_3950.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*plVar22 + 0x70);
            if (local_3950.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_3950.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count =
                     (local_3950.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_3950.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_use_count =
                     (local_3950.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            bVar19 = PartIsHighlighted(this,&local_3950);
            if (local_3950.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_3950.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            bVar23 = local_3a08[0];
            if (bVar19) {
              uVar21 = (this->m_colors).pinDefaultColor;
              local_3a2c = (this->m_colors).pinDefaultTextColor;
              local_3a30 = 0.0;
              bVar23 = 1;
              auVar11._12_4_ = 0;
              auVar11._0_12_ = local_3a08._4_12_;
              local_3a08 = auVar11 << 0x20;
            }
            peVar2 = (element_type *)*plVar22;
            iVar13 = *(int *)&(peVar2->super_BoardElement).field_0xc;
            if (iVar13 == 4) {
              uVar21 = (this->m_colors).pinTestPadColor & local_3a0c | local_3a10;
              local_39e8._0_4_ = (this->m_colors).pinTestPadFillColor & local_3a0c | local_3a10;
              bVar23 = 0;
            }
            if (((peVar2->component).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->visualmode == '\x01') {
              uVar21 = (this->m_colors).pinDefaultColor;
              local_3a2c = (this->m_colors).pinDefaultTextColor;
              local_3a30 = 0.0;
              bVar23 = 1;
              auVar12._12_4_ = 0;
              auVar12._0_12_ = local_3a08._4_12_;
              local_3a08 = auVar12 << 0x20;
            }
            pNVar3 = peVar2->net;
            if (iVar13 == 1 || pNVar3 == (Net *)0x0) {
              uVar21 = (this->m_colors).pinNotConnectedColor;
LAB_0011eecd:
              uVar21 = uVar21 & local_3a0c | local_3a10;
            }
            else if (pNVar3->is_ground == true) {
              uVar21 = (this->m_colors).pinGroundColor;
              goto LAB_0011eecd;
            }
            peVar4 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            bVar19 = true;
            if ((peVar4 != (element_type *)0x0) && (pNVar3 == peVar4->net)) {
              dVar8 = (this->config).fontSize * 0.5;
              if ((double)fVar25 < dVar8) {
                fVar25 = (float)dVar8;
              }
              uVar21 = (this->m_colors).pinSameNetColor;
              local_3a2c = (this->m_colors).pinSameNetTextColor;
              local_39e8._0_4_ = (this->m_colors).pinSameNetFillColor;
              local_3a30 = 0.0;
              local_3a08._0_4_ = 1;
              bVar19 = false;
              bVar23 = 1;
            }
            if (peVar2 == peVar4) {
              dVar8 = (this->config).fontSize * 0.5;
              if ((double)fVar25 < dVar8) {
                fVar25 = (float)dVar8;
              }
              uVar21 = (this->m_colors).pinSelectedColor;
              local_3a2c = (this->m_colors).pinSelectedTextColor;
              local_39e8._0_4_ = (this->m_colors).pinSelectedFillColor;
              local_3a30 = 0.0;
              local_3a08._0_4_ = 1;
              bVar19 = false;
              bVar23 = 1;
            }
            auVar10 = local_3a08;
            iVar13 = std::__cxx11::string::compare((char *)&peVar2->name);
            if (iVar13 == 0) {
              uVar21 = (this->m_colors).pinA1PadColor;
              local_3a08._1_3_ = 0;
              local_3a08[0] = uVar21 != 0;
              local_3a08._4_12_ = auVar10._4_12_;
              bVar19 = false;
              local_39e8._0_4_ = uVar21;
            }
            auVar10 = local_3a08;
            iVar13 = std::__cxx11::string::compare((char *)(*plVar22 + 0x10));
            if ((iVar13 == 0) &&
               ((ulong)(uint)(this->config).pinA1threshold <=
                (ulong)(*(long *)(*(long *)(*plVar22 + 0x68) + 0x60) -
                        *(long *)(*(long *)(*plVar22 + 0x68) + 0x58) >> 4))) {
              uVar21 = (this->m_colors).pinA1PadColor;
              local_3a08._1_3_ = 0;
              local_3a08[0] = uVar21 != 0;
              local_3a08._4_12_ = auVar10._4_12_;
              bVar19 = false;
              local_39e8._0_4_ = uVar21;
            }
            lVar18 = *(long *)(*plVar22 + 0x68);
            lVar5 = *(long *)(lVar18 + 0x60);
            lVar18 = *(long *)(lVar18 + 0x58);
            local_397c = *(int *)(*plVar22 + 0xc);
            bVar24 = local_397c != 4;
            fVar27 = roundf(fVar25);
            IVar17 = local_39a8;
            iVar13 = (int)fVar27;
            if (0x1f < iVar13) {
              iVar13 = 0x20;
            }
            if (iVar13 < 9) {
              iVar13 = 8;
            }
            bVar23 = bVar24 & bVar23 & 0x10U < (ulong)(lVar5 - lVar18);
            fVar27 = fVar25;
            if ((bVar23 == 1) && (dVar8 = (this->config).fontSize * 0.5, (double)fVar25 < dVar8)) {
              fVar27 = (float)dVar8;
            }
            fVar25 = fVar25 * 0.5 + 0.5;
            local_39a8 = local_3978._0_8_;
            if (local_397c == 4) {
              if ((fVar27 <= 3.0) || ((this->config).slowCPU != false)) {
                local_39a8 = IVar17;
                if (local_3a30 < fVar27) {
                  local_39a8.y = (float)local_3978._4_4_ - fVar25;
                  local_39a8.x = (float)local_3978._0_4_ - fVar25;
                  local_39c8[0].y = fVar25 + (float)local_3978._4_4_;
                  local_39c8[0].x = fVar25 + (float)local_3978._0_4_;
                  ImDrawList::AddRectFilled(draw,&local_39a8,local_39c8,local_39e8._0_4_,0.0,0);
                }
              }
              else {
                ImDrawList::AddCircleFilled(draw,&local_39a8,fVar27,local_39e8._0_4_,iVar13);
                auVar10 = local_3978;
                local_39a8.x = (float)local_3978._0_4_;
                local_39a8.y = (float)local_3978._4_4_;
                local_3978 = auVar10;
                ImDrawList::AddCircle(draw,&local_39a8,fVar27,uVar21,iVar13,1.0);
              }
            }
            else if ((fVar27 <= 3.0) || (fVar27 <= local_3a30)) {
              local_39a8 = IVar17;
              if (local_3a30 < fVar27) {
                if (local_3a08[0] != '\0') {
                  local_39a8.y = (float)local_3978._4_4_ - fVar25;
                  local_39a8.x = (float)local_3978._0_4_ - fVar25;
                  local_39c8[0].y = fVar25 + (float)local_3978._4_4_;
                  local_39c8[0].x = fVar25 + (float)local_3978._0_4_;
                  ImDrawList::AddRectFilled(draw,&local_39a8,local_39c8,local_39e8._0_4_,0.0,0);
                }
                if (bVar19) {
                  local_39a8.y = (float)local_3978._4_4_ - fVar25;
                  local_39a8.x = (float)local_3978._0_4_ - fVar25;
                  local_39c8[0].y = fVar25 + (float)local_3978._4_4_;
                  local_39c8[0].x = fVar25 + (float)local_3978._0_4_;
                  ImDrawList::AddRect(draw,&local_39a8,local_39c8,uVar21,0.0,0,1.0);
                }
              }
            }
            else if (((this->config).pinShapeSquare == false) && ((this->config).slowCPU != true)) {
              if (local_3a08[0] != '\0') {
                ImDrawList::AddCircleFilled(draw,&local_39a8,fVar27,local_39e8._0_4_,iVar13);
                IVar17 = local_39a8;
              }
              local_39a8 = IVar17;
              if (bVar19) {
                local_39a8.y = (float)local_3978._4_4_;
                local_39a8.x = (float)local_3978._0_4_;
                ImDrawList::AddCircle(draw,&local_39a8,fVar27,uVar21,iVar13,1.0);
              }
            }
            else {
              local_39a8 = IVar17;
              if (local_3a08[0] != '\0') {
                local_39a8.y = (float)local_3978._4_4_ - fVar25;
                local_39a8.x = (float)local_3978._0_4_ - fVar25;
                local_39c8[0].y = fVar25 + (float)local_3978._4_4_;
                local_39c8[0].x = fVar25 + (float)local_3978._0_4_;
                ImDrawList::AddRectFilled(draw,&local_39a8,local_39c8,local_39e8._0_4_,0.0,0);
              }
              if (bVar19) {
                local_39a8.y = (float)local_3978._4_4_ - fVar25;
                local_39a8.x = (float)local_3978._0_4_ - fVar25;
                local_39c8[0].y = fVar25 + (float)local_3978._4_4_;
                local_39c8[0].x = fVar25 + (float)local_3978._0_4_;
                ImDrawList::AddRect(draw,&local_39a8,local_39c8,uVar21,0.0,0,1.0);
              }
            }
            if ((byte)(bVar23 | 3.0 < fVar27 & (this->config).showPinName) == 1) {
              local_39c8[0] = (ImVec2)local_39b8;
              lVar18 = *(long *)(*plVar22 + 0x30);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_39c8,lVar18,*(long *)(*plVar22 + 0x38) + lVar18);
              std::__cxx11::string::append((char *)local_39c8);
              pIVar16 = (ImVec2 *)
                        std::__cxx11::string::_M_append
                                  ((char *)local_39c8,*(ulong *)(*(long *)(*plVar22 + 0x60) + 0x10))
              ;
              local_39a8 = (ImVec2)&local_3998;
              IVar17 = (ImVec2)(pIVar16 + 2);
              if (*pIVar16 == IVar17) {
                local_3998 = *(long *)IVar17;
                IStack_3990 = pIVar16[3];
              }
              else {
                local_3998 = *(long *)IVar17;
                local_39a8 = *pIVar16;
              }
              local_39a0 = pIVar16[1];
              *pIVar16 = IVar17;
              pIVar16[1].x = 0.0;
              pIVar16[1].y = 0.0;
              *(undefined1 *)&pIVar16[2].x = 0;
              if (local_39c8[0] != (ImVec2)local_39b8) {
                operator_delete((void *)local_39c8[0],local_39b8[0] + 1);
              }
              pIVar14 = ImGui::GetIO();
              this_01 = *(pIVar14->Fonts->Fonts).Data;
              IVar17 = ImFont::CalcTextSizeA
                                 (this_01,1.0,3.4028235e+38,0.0,(char *)local_39a8,(char *)0x0,
                                  (char **)0x0);
              auVar6._8_4_ = extraout_XMM0_Dc_00;
              auVar6._0_4_ = IVar17.x;
              auVar6._4_4_ = IVar17.y;
              auVar6._12_4_ = extraout_XMM0_Dd_00;
              fVar25 = (fVar27 * 1.5) / IVar17.y;
              IVar9 = ImFont::CalcTextSizeA
                                (this_01,fVar25,3.4028235e+38,0.0,*(char **)(*plVar22 + 0x30),
                                 (char *)0x0,(char **)0x0);
              local_3a08._0_4_ = IVar17.x;
              fVar27 = (fVar27 * 2.125) / (float)local_3a08._0_4_;
              local_3a08._0_4_ = fVar25;
              if (fVar27 <= fVar25) {
                local_3a08._0_4_ = fVar27;
              }
              local_3a08._4_12_ = auVar6._4_12_;
              IVar17 = ImFont::CalcTextSizeA
                                 (this_01,(float)local_3a08._0_4_,3.4028235e+38,0.0,
                                  *(char **)(*(long *)(*plVar22 + 0x60) + 0x10),(char *)0x0,
                                  (char **)0x0);
              local_39f8 = IVar9.x;
              fStack_39f4 = IVar9.y;
              local_39c8[0].y = (float)local_3978._4_4_ - fStack_39f4;
              local_39c8[0].x = (float)local_3978._0_4_ - local_39f8 * 0.5;
              auVar7._8_4_ = extraout_XMM0_Dc_01;
              auVar7._0_4_ = IVar17.x;
              auVar7._4_4_ = IVar17.y;
              auVar7._12_4_ = extraout_XMM0_Dd_01;
              local_3984.x = (float)local_3978._0_4_ - IVar17.x * 0.5;
              local_3984.y = local_3938;
              if (this_01->FontSize * 0.75 <= fVar25) {
                font = this_01;
                if ((this_01->FontSize * 1.5 < fVar25) &&
                   (pIVar14 = ImGui::GetIO(), fVar27 = (pIVar14->Fonts->Fonts).Data[1]->FontSize,
                   this_01->FontSize <= fVar27 && fVar27 != this_01->FontSize)) {
                  pIVar14 = ImGui::GetIO();
                  lVar18 = 8;
                  goto LAB_0011f5f1;
                }
              }
              else {
                pIVar14 = ImGui::GetIO();
                lVar18 = 0x10;
LAB_0011f5f1:
                font = *(ImFont **)((long)(pIVar14->Fonts->Fonts).Data + lVar18);
              }
              if (this_01->FontSize * 0.75 <= (float)local_3a08._0_4_) {
                if ((this_01->FontSize * 1.5 < (float)local_3a08._0_4_) &&
                   (pIVar14 = ImGui::GetIO(), fVar27 = (pIVar14->Fonts->Fonts).Data[1]->FontSize,
                   this_01->FontSize <= fVar27 && fVar27 != this_01->FontSize)) {
                  pIVar14 = ImGui::GetIO();
                  lVar18 = 8;
                  goto LAB_0011f667;
                }
              }
              else {
                pIVar14 = ImGui::GetIO();
                lVar18 = 0x10;
LAB_0011f667:
                this_01 = *(ImFont **)((long)(pIVar14->Fonts->Fonts).Data + lVar18);
              }
              fVar27 = this->m_scale * 0.5;
              local_39e8._4_4_ = IVar17.y;
              local_3958.x = local_3984.x - fVar27;
              local_3958.y = local_3984.y;
              local_3960.x = IVar17.x + local_3984.x + fVar27;
              local_3960.y = (float)local_39e8._4_4_ + local_3984.y;
              ImDrawList::AddRectFilled
                        (draw,&local_3958,&local_3960,(this->m_colors).pinTextBackgroundColor,fVar27
                         ,0);
              ImDrawListSplitter::SetCurrentChannel(local_3968,draw,4);
              ImDrawList::AddText(draw,font,fVar25,local_39c8,local_3a2c,*(char **)(*plVar22 + 0x30)
                                  ,(char *)0x0,0.0,(ImVec4 *)0x0);
              ImDrawList::AddText(draw,this_01,(float)local_3a08._0_4_,&local_3984,local_3a2c,
                                  *(char **)(*(long *)(*plVar22 + 0x60) + 0x10),(char *)0x0,0.0,
                                  (ImVec4 *)0x0);
              ImDrawListSplitter::SetCurrentChannel(local_3968,draw,3);
              local_39e8._0_16_ = auVar7;
              if (local_39a8 != (ImVec2)&local_3998) {
                operator_delete((void *)local_39a8,local_3998 + 1);
              }
            }
          }
        }
        plVar22 = plVar22 + 2;
      } while (plVar22 != local_3940);
    }
  }
  if (pvStack_d80 != (void *)0x0) {
    ImGui::MemFree(pvStack_d80);
  }
  return;
}

Assistant:

inline void BoardView::DrawPins(ImDrawList *draw) {

	uint32_t cmask  = 0xFFFFFFFF;
	uint32_t omask  = 0x00000000;
	float threshold = 0;
	auto io         = ImGui::GetIO();

	if (!config.showPins) return;

	/*
	 * If we have a pin selected, then it makes it
	 * easier to see where the associated pins are
	 * by masking out (alpha or channel) the other
	 * pins so they're fainter.
	 */
	if (config.pinSelectMasks) {
		if (m_pinSelected || m_pinHighlighted.size()) {
			cmask = m_colors.selectedMaskPins;
			omask = m_colors.orMaskPins;
		}
	}

	if (config.slowCPU) {
		threshold      = 2.0f;
	}
	if (config.pinSizeThresholdLow > threshold) threshold = config.pinSizeThresholdLow;

	draw->ChannelsSetCurrent(kChannelPins);

	if (m_pinSelected) DrawNetWeb(draw);

	for (auto &pin : m_board->Pins()) {
		float psz           = pin->diameter * m_scale;
		uint32_t fill_color = 0xFFFF8888; // fallback fill colour
		uint32_t text_color = m_colors.pinDefaultTextColor;
		uint32_t color      = (m_colors.pinDefaultColor & cmask) | omask;
		bool fill_pin       = false;
		bool show_text      = false;
		bool draw_ring      = true;

		// continue if pin is not visible anyway
		if (!BoardElementIsVisible(pin)) continue;

		ImVec2 pos = CoordToScreen(pin->position.x, pin->position.y);
		{
			if (!IsVisibleScreen(pos.x, pos.y, psz, io)) continue;
		}

		if ((!m_pinSelected) && (psz < threshold)) continue;

		// color & text depending on app state & pin type

		{
			/*
			 * Pins resulting from a net search
			 */
			if (contains(pin, m_pinHighlighted)) {
				if (psz < config.fontSize / 2) psz = config.fontSize / 2;
				text_color = m_colors.pinSelectedTextColor;
				fill_color = m_colors.pinSelectedFillColor;
				color      = m_colors.pinSelectedColor;
				// text_color = color = m_colors.pinSameNetColor;
				fill_pin  = true;
				show_text = true;
				draw_ring = true;
				threshold = 0;
				//				draw->AddCircle(ImVec2(pos.x, pos.y), psz * pinHaloDiameter, ImColor(0xff0000ff), 32);
			}

			/*
			 * If the part is selected, as part of search or otherwise
			 */
			if (PartIsHighlighted(pin->component)) {
				color      = m_colors.pinDefaultColor;
				text_color = m_colors.pinDefaultTextColor;
				fill_pin   = false;
				draw_ring  = true;
				show_text  = true;
				threshold  = 0;
			}

			if (pin->type == Pin::kPinTypeTestPad) {
				color      = (m_colors.pinTestPadColor & cmask) | omask;
				fill_color = (m_colors.pinTestPadFillColor & cmask) | omask;
				show_text  = false;
			}

			// If the part itself is highlighted ( CVMShowPins )
			// if (p_pin->component->visualmode == p_pin->component->CVMSelected) {
			if (pin->component->visualmode == pin->component->CVMSelected) {
				color      = m_colors.pinDefaultColor;
				text_color = m_colors.pinDefaultTextColor;
				fill_pin   = false;
				draw_ring  = true;
				show_text  = true;
				threshold  = 0;
			}

			if (!pin->net || pin->type == Pin::kPinTypeNotConnected) {
				color = (m_colors.pinNotConnectedColor & cmask) | omask;
			} else {
				if (pin->net->is_ground) color = (m_colors.pinGroundColor & cmask) | omask;
			}

			// pin is on the same net as selected pin: highlight > rest
			if (m_pinSelected && pin->net == m_pinSelected->net) {
				if (psz < config.fontSize / 2) psz = config.fontSize / 2;
				color      = m_colors.pinSameNetColor;
				text_color = m_colors.pinSameNetTextColor;
				fill_color = m_colors.pinSameNetFillColor;
				draw_ring  = false;
				fill_pin   = true;
				show_text  = true; // is this something we want? Maybe an optional thing?
				threshold  = 0;
			}

			// pin selected overwrites everything
			// if (p_pin == m_pinSelected) {
			if (pin == m_pinSelected) {
				if (psz < config.fontSize / 2) psz = config.fontSize / 2;
				color      = m_colors.pinSelectedColor;
				text_color = m_colors.pinSelectedTextColor;
				fill_color = m_colors.pinSelectedFillColor;
				draw_ring  = false;
				show_text  = true;
				fill_pin   = true;
				threshold  = 0;
			}

			// Check for BGA pin '1'
			//
			if (pin->name == "A1") {
				color = fill_color = m_colors.pinA1PadColor;
				fill_pin           = m_colors.pinA1PadColor;
				draw_ring          = false;
			}

			if ((pin->number == "1")) {
				if (pin->component->pins.size() >= static_cast<unsigned int>(config.pinA1threshold)) { // config.pinA1threshold is never negative
					color = fill_color = m_colors.pinA1PadColor;
					fill_pin           = m_colors.pinA1PadColor;
					draw_ring          = false;
				}
			}

			// don't show text if it doesn't make sense
			if (pin->component->pins.size() <= 1) show_text = false;
			if (pin->type == Pin::kPinTypeTestPad) show_text = false;
		}

		// Drawing
		{
			int segments;
			//			draw->ChannelsSetCurrent(kChannelImages);

			// for the round pin representations, choose how many circle segments need
			// based on the pin size
			segments = round(psz);
			if (segments > 32) segments = 32;
			if (segments < 8) segments = 8;
			float h = psz / 2 + 0.5f;

			/*
			 * if we're going to be showing the text of a pin, then we really
			 * should make sure that the drawn pin is at least as big as a single
			 * character so it doesn't look messy
			 */
			if ((show_text) && (psz < config.fontSize / 2)) psz = config.fontSize / 2;

			switch (pin->type) {
				case Pin::kPinTypeTestPad:
					if ((psz > 3) && (!config.slowCPU)) {
						draw->AddCircleFilled(ImVec2(pos.x, pos.y), psz, fill_color, segments);
						draw->AddCircle(ImVec2(pos.x, pos.y), psz, color, segments);
					} else if (psz > threshold) {
						draw->AddRectFilled(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), fill_color);
					}
					break;
				default:
					if ((psz > 3) && (psz > threshold)) {
						if (config.pinShapeSquare || config.slowCPU) {
							if (fill_pin)
								draw->AddRectFilled(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), fill_color);
							if (draw_ring) draw->AddRect(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), color);
						} else {
							if (fill_pin) draw->AddCircleFilled(ImVec2(pos.x, pos.y), psz, fill_color, segments);
							if (draw_ring) draw->AddCircle(ImVec2(pos.x, pos.y), psz, color, segments);
						}
					} else if (psz > threshold) {
						if (fill_pin) draw->AddRectFilled(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), fill_color);
						if (draw_ring) draw->AddRect(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), color);
					}
			}

			// if (p_pin == m_pinSelected) {
			//		if (pin.get() == m_pinSelected) {
			//			draw->AddCircle(ImVec2(pos.x, pos.y), psz + 1.25, m_colors.pinSelectedTextColor, segments);
			//		}

			//		if ((color == m_colors.pinSameNetColor) && (pinHalo == true)) {
			//			draw->AddCircle(ImVec2(pos.x, pos.y), psz * pinHaloDiameter, m_colors.pinHaloColor, segments,
			// config.pinHaloThickness);
			//		}

			// Show all pin names when config.showPinName is enabled and pin diameter is above threshold or show pin name only for selected part
			if ((config.showPinName && psz > 3) || show_text) {
				std::string text = pin->name + "\n" + pin->net->name;
				ImFont *font = ImGui::GetIO().Fonts->Fonts[0]; // Default font
				ImVec2 text_size_normalized = font->CalcTextSizeA(1.0f, FLT_MAX, 0.0f, text.c_str());

				float maxfontwidth = psz * 2.125/ text_size_normalized.x; // Fit horizontally with 6.75% overflow (should still avoid colliding with neighbours)
				float maxfontheight = psz * 1.5/ text_size_normalized.y; // Fit vertically with 25% top/bottom padding
				float maxfontsize = std::min(maxfontwidth, maxfontheight);

				// Font size for pin name only depends on height of text (rather than width of full text incl. net name) to scale to pin bounding box
				ImVec2 size_pin_name = font->CalcTextSizeA(maxfontheight, FLT_MAX, 0.0f, pin->name.c_str());
				// Font size for net name also depends on width of full text to avoid overflowing too much and colliding with text from other pin
				ImVec2 size_net_name = font->CalcTextSizeA(maxfontsize, FLT_MAX, 0.0f, pin->net->name.c_str());

				// Show pin name above net name, full text is centered vertically
				ImVec2 pos_pin_name   = ImVec2(pos.x - size_pin_name.x * 0.5f, pos.y - size_pin_name.y);
				ImVec2 pos_net_name   = ImVec2(pos.x - size_net_name.x * 0.5f, pos.y);

				ImFont *font_pin_name = font;
				if (maxfontheight < font->FontSize * 0.75) {
					font_pin_name = ImGui::GetIO().Fonts->Fonts[2]; // Use smaller font for pin name
				} else if (maxfontheight > font->FontSize * 1.5 && ImGui::GetIO().Fonts->Fonts[1]->FontSize > font->FontSize) {
					font_pin_name = ImGui::GetIO().Fonts->Fonts[1]; // Use larger font for pin name
				}

				ImFont *font_net_name = font;
				if (maxfontsize < font->FontSize * 0.75) {
					font_net_name = ImGui::GetIO().Fonts->Fonts[2]; // Use smaller font for net name
				} else if (maxfontsize > font->FontSize * 1.5 && ImGui::GetIO().Fonts->Fonts[1]->FontSize > font->FontSize) {
					font_net_name = ImGui::GetIO().Fonts->Fonts[1]; // Use larger font for net name
				}

				// Background rectangle
				draw->AddRectFilled(ImVec2(pos_net_name.x - m_scale * 0.5f, pos_net_name.y), // Begining of text with slight padding
										ImVec2(pos_net_name.x + size_net_name.x + m_scale * 0.5f, pos_net_name.y + size_net_name.y), // End of text with slight padding
										m_colors.pinTextBackgroundColor,
										m_scale * 0.5f/*rounding*/);

				draw->ChannelsSetCurrent(kChannelText);
				draw->AddText(font_pin_name, maxfontheight, pos_pin_name, text_color, pin->name.c_str());
				draw->AddText(font_net_name, maxfontsize, pos_net_name, text_color, pin->net->name.c_str());
				draw->ChannelsSetCurrent(kChannelPins);
			}
		}
	}
}